

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::PartialBlockManager::Merge(PartialBlockManager *this,PartialBlockManager *other)

{
  bool bVar1;
  uint segment_size;
  idx_t iVar2;
  pointer pPVar3;
  type pPVar4;
  _Base_ptr p_Var5;
  InternalException *pIVar6;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Var7;
  allocator local_a9;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  uint32_t local_88;
  undefined4 uStack_84;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Stack_80;
  PartialBlockManager *local_78;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
  *local_70;
  undefined1 local_68 [16];
  size_type local_58;
  undefined8 uStack_50;
  uint32_t local_48;
  undefined4 uStack_44;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Stack_40;
  
  if (other == this) {
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)local_a8,"Cannot merge into itself",&local_a9);
    InternalException::InternalException(pIVar6,(string *)local_a8);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var5 = (other->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
              *)&this->partially_filled_blocks;
  local_78 = other;
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 ==
        &(other->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header) {
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
      ::clear(&(local_78->partially_filled_blocks)._M_t);
      return;
    }
    if (p_Var5[1]._M_parent == (_Base_ptr)0x0) break;
    iVar2 = BlockManager::GetBlockSize(this->block_manager);
    segment_size = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                             (iVar2 - *(long *)(p_Var5 + 1));
    bVar1 = HasBlockAllocation(this,segment_size);
    if (bVar1) {
      GetBlockAllocation((PartialBlockAllocation *)local_a8,this,segment_size);
      pPVar3 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
               operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                           *)&_Stack_80);
      pPVar4 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
               operator*((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                          *)&p_Var5[1]._M_parent);
      (*pPVar3->_vptr_PartialBlock[3])
                (pPVar3,pPVar4,(ulong)(uint)local_98._12_4_,(ulong)segment_size);
      local_98._12_4_ = local_98._12_4_ + segment_size;
      local_68._0_8_ = local_a8._0_8_;
      local_68._8_8_ = local_a8._8_8_;
      local_48 = local_88;
      uStack_44 = uStack_84;
      _Stack_40._M_head_impl = _Stack_80._M_head_impl;
      uStack_50._4_4_ = local_98._12_4_;
      uStack_50._0_4_ = local_98._8_4_;
      local_58 = local_98._M_allocated_capacity;
      _Stack_80._M_head_impl = (PartialBlock *)0x0;
      RegisterPartialBlock(this,(PartialBlockAllocation *)local_68);
      if (_Stack_40._M_head_impl != (PartialBlock *)0x0) {
        (**(code **)(*(long *)_Stack_40._M_head_impl + 8))();
      }
      _Stack_40._M_head_impl = (PartialBlock *)0x0;
      _Var7._M_head_impl = _Stack_80._M_head_impl;
    }
    else {
      local_a8._0_8_ = *(undefined8 *)(p_Var5 + 1);
      local_a8._8_8_ = p_Var5[1]._M_parent;
      p_Var5[1]._M_parent = (_Base_ptr)0x0;
      ::std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
      ::
      _M_emplace_equal<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>
                (local_70,(pair<unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>
                           *)local_a8);
      _Var7._M_head_impl = (PartialBlock *)local_a8._8_8_;
    }
    if ((_Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
        _Var7._M_head_impl != (PartialBlock *)0x0) {
      (**(code **)(*(long *)_Var7._M_head_impl + 8))();
    }
    p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
  }
  pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)local_a8,"Empty partially filled block found",&local_a9);
  InternalException::InternalException(pIVar6,(string *)local_a8);
  __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PartialBlockManager::Merge(PartialBlockManager &other) {
	if (&other == this) {
		throw InternalException("Cannot merge into itself");
	}
	// for each partially filled block in the other manager, check if we can merge it into an existing block in this
	// manager
	for (auto &e : other.partially_filled_blocks) {
		if (!e.second) {
			throw InternalException("Empty partially filled block found");
		}
		auto used_space = NumericCast<uint32_t>(block_manager.GetBlockSize() - e.first);
		if (HasBlockAllocation(used_space)) {
			// we can merge this block into an existing block - merge them
			// merge blocks
			auto allocation = GetBlockAllocation(used_space);
			allocation.partial_block->Merge(*e.second, allocation.state.offset, used_space);

			// re-register the partial block
			allocation.state.offset += used_space;
			RegisterPartialBlock(std::move(allocation));
		} else {
			// we cannot merge this block - append it directly to the current block manager
			partially_filled_blocks.insert(make_pair(e.first, std::move(e.second)));
		}
	}
	other.partially_filled_blocks.clear();
}